

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

StringPiece __thiscall icu_63::Formattable::getDecimalNumber(Formattable *this,UErrorCode *status)

{
  UBool UVar1;
  CharString *this_00;
  StringPiece SVar2;
  CharString *decimalStr;
  UErrorCode *status_local;
  Formattable *this_local;
  int32_t local_10;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fDecimalStr == (CharString *)0x0) {
      this_00 = internalGetCharString(this,status);
      if (this_00 == (CharString *)0x0) {
        StringPiece::StringPiece((StringPiece *)&this_local,"");
      }
      else {
        SVar2 = CharString::toStringPiece(this_00);
        this_local = (Formattable *)SVar2.ptr_;
        local_10 = SVar2.length_;
      }
    }
    else {
      SVar2 = CharString::toStringPiece(this->fDecimalStr);
      this_local = (Formattable *)SVar2.ptr_;
      local_10 = SVar2.length_;
    }
  }
  else {
    StringPiece::StringPiece((StringPiece *)&this_local,"");
  }
  SVar2.length_ = local_10;
  SVar2.ptr_ = (char *)this_local;
  SVar2._12_4_ = 0;
  return SVar2;
}

Assistant:

StringPiece Formattable::getDecimalNumber(UErrorCode &status) {
    if (U_FAILURE(status)) {
        return "";
    }
    if (fDecimalStr != NULL) {
      return fDecimalStr->toStringPiece();
    }

    CharString *decimalStr = internalGetCharString(status);
    if(decimalStr == NULL) {
      return ""; // getDecimalNumber returns "" for error cases
    } else {
      return decimalStr->toStringPiece();
    }
}